

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::undo
          (HighsPostsolveStack *this,HighsOptions *options,HighsSolution *solution,HighsBasis *basis
          ,HighsInt report_col)

{
  byte bVar1;
  byte bVar2;
  reference pvVar3;
  reference pvVar4;
  HighsBasis *basis_00;
  byte *in_RCX;
  long in_RDX;
  HighsPostsolveStack *in_RDI;
  uint in_R8D;
  SlackColSubstitution reduction_13;
  DuplicateColumn reduction_12;
  DuplicateRow reduction_11;
  ForcingColumnRemovedRow reduction_10;
  ForcingColumn reduction_9;
  ForcingRow reduction_8;
  RedundantRow reduction_7;
  FixedCol reduction_6;
  SingletonRow reduction_5;
  EqualityRowAdditions reduction_4;
  EqualityRowAddition reduction_3;
  DoubletonEquation reduction_2;
  FreeColSubstitution reduction_1;
  LinearTransform reduction;
  size_t i;
  bool perform_basis_postsolve;
  bool perform_dual_postsolve;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe48;
  HighsInt origSize;
  undefined4 in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  uint in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  HighsBasis *in_stack_fffffffffffffe68;
  HighsSolution *in_stack_fffffffffffffe70;
  HighsOptions *in_stack_fffffffffffffe78;
  HighsBasis *in_stack_fffffffffffffe80;
  HighsSolution *in_stack_fffffffffffffe88;
  HighsSolution *in_stack_fffffffffffffe90;
  HighsOptions *in_stack_fffffffffffffe98;
  HighsBasis *in_stack_fffffffffffffea0;
  HighsOptions *in_stack_fffffffffffffea8;
  HighsSolution *in_stack_fffffffffffffeb0;
  HighsOptions *in_stack_fffffffffffffeb8;
  ForcingColumn *in_stack_fffffffffffffec0;
  HighsOptions *in_stack_fffffffffffffec8;
  EqualityRowAdditions *in_stack_fffffffffffffed0;
  HighsBasis *in_stack_ffffffffffffff00;
  HighsSolution *in_stack_ffffffffffffff08;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff10;
  HighsOptions *in_stack_ffffffffffffff18;
  ForcingRow *in_stack_ffffffffffffff20;
  HighsBasis *in_stack_ffffffffffffff38;
  HighsSolution *in_stack_ffffffffffffff40;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff48;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff50;
  HighsOptions *in_stack_ffffffffffffff58;
  FreeColSubstitution *in_stack_ffffffffffffff60;
  HighsBasis *in_stack_ffffffffffffff70;
  HighsSolution *in_stack_ffffffffffffff78;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff80;
  HighsOptions *in_stack_ffffffffffffff88;
  SlackColSubstitution *in_stack_ffffffffffffff90;
  HighsBasis *in_stack_ffffffffffffff98;
  HighsSolution *in_stack_ffffffffffffffa0;
  HighsOptions *in_stack_ffffffffffffffa8;
  DuplicateColumn *in_stack_ffffffffffffffb0;
  HighsOptions *in_stack_ffffffffffffffb8;
  DoubletonEquation *in_stack_ffffffffffffffc0;
  size_type local_30;
  
  origSize = (HighsInt)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  HighsDataStack::resetPosition
            ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  bVar1 = *(byte *)(in_RDX + 1);
  bVar2 = *in_RCX;
  undoIterateBackwards<double>
            (in_RDI,(vector<double,_std::allocator<double>_> *)
                    CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),origSize);
  undoIterateBackwards<double>
            (in_RDI,(vector<double,_std::allocator<double>_> *)
                    CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),origSize);
  if ((bVar1 & 1) != 0) {
    undoIterateBackwards<double>
              (in_RDI,(vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),origSize);
    undoIterateBackwards<double>
              (in_RDI,(vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),origSize);
  }
  if ((bVar2 & 1) != 0) {
    undoIterateBackwards<HighsBasisStatus>
              (in_RDI,(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),origSize);
    undoIterateBackwards<HighsBasisStatus>
              (in_RDI,(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),origSize);
  }
  for (local_30 = std::
                  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                  ::size(&in_RDI->reductions); local_30 != 0; local_30 = local_30 - 1) {
    if (-1 < (int)in_R8D) {
      in_stack_fffffffffffffe54 = (int)local_30 - 1;
      pvVar3 = std::
               vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
               ::operator[](&in_RDI->reductions,local_30 - 1);
      in_stack_fffffffffffffe58 = (uint)pvVar3->first;
      in_stack_fffffffffffffe5c = in_R8D;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),(long)(int)in_R8D)
      ;
      printf("Before  reduction %2d (type %2d): col_value[%2d] = %g\n",*pvVar4,
             (ulong)in_stack_fffffffffffffe54,(ulong)in_stack_fffffffffffffe58,
             (ulong)in_stack_fffffffffffffe5c);
    }
    pvVar3 = std::
             vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
             ::operator[](&in_RDI->reductions,local_30 - 1);
    basis_00 = (HighsBasis *)(ulong)pvVar3->first;
    switch(basis_00) {
    case (HighsBasis *)0x0:
      HighsDataStack::pop<presolve::HighsPostsolveStack::LinearTransform,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (LinearTransform *)basis_00);
      LinearTransform::undo
                ((LinearTransform *)in_RDI,
                 (HighsOptions *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (HighsSolution *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      break;
    case (HighsBasis *)0x1:
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::FreeColSubstitution,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (FreeColSubstitution *)basis_00);
      FreeColSubstitution::undo
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      break;
    case (HighsBasis *)0x2:
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::DoubletonEquation,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (DoubletonEquation *)basis_00);
      DoubletonEquation::undo
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)in_stack_ffffffffffffffb0,(HighsSolution *)in_stack_ffffffffffffffa8,
                 (HighsBasis *)in_stack_ffffffffffffffa0);
      break;
    case (HighsBasis *)0x3:
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::EqualityRowAddition,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (EqualityRowAddition *)basis_00);
      EqualityRowAddition::undo
                ((EqualityRowAddition *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      break;
    case (HighsBasis *)0x4:
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::EqualityRowAdditions,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (EqualityRowAdditions *)basis_00);
      EqualityRowAdditions::undo
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)in_stack_fffffffffffffec0,
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (HighsBasis *)in_stack_fffffffffffffea8);
      break;
    case (HighsBasis *)0x5:
      HighsDataStack::pop<presolve::HighsPostsolveStack::SingletonRow,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (SingletonRow *)basis_00);
      SingletonRow::undo((SingletonRow *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                         in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      break;
    case (HighsBasis *)0x6:
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::FixedCol,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (FixedCol *)basis_00);
      FixedCol::undo((FixedCol *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)in_stack_fffffffffffffea0,(HighsSolution *)in_stack_fffffffffffffe98,
                     (HighsBasis *)in_stack_fffffffffffffe90);
      break;
    case (HighsBasis *)0x7:
      HighsDataStack::pop<presolve::HighsPostsolveStack::RedundantRow,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (RedundantRow *)basis_00);
      RedundantRow::undo((RedundantRow *)in_RDI,
                         (HighsOptions *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                         (HighsSolution *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),basis_00);
      break;
    case (HighsBasis *)0x8:
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::ForcingRow,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (ForcingRow *)basis_00);
      ForcingRow::undo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
                       ,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      break;
    case (HighsBasis *)0x9:
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::ForcingColumn,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (ForcingColumn *)basis_00);
      ForcingColumn::undo(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                          (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                           *)in_stack_fffffffffffffeb0,(HighsSolution *)in_stack_fffffffffffffea8,
                          in_stack_fffffffffffffea0);
      break;
    case (HighsBasis *)0xa:
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::ForcingColumnRemovedRow,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (ForcingColumnRemovedRow *)basis_00);
      ForcingColumnRemovedRow::undo
                ((ForcingColumnRemovedRow *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      break;
    case (HighsBasis *)0xb:
      HighsDataStack::pop<presolve::HighsPostsolveStack::DuplicateRow,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (DuplicateRow *)basis_00);
      DuplicateRow::undo((DuplicateRow *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         in_stack_fffffffffffffe90,(HighsBasis *)in_stack_fffffffffffffe88);
      break;
    case (HighsBasis *)0xc:
      HighsDataStack::pop<presolve::HighsPostsolveStack::DuplicateColumn,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (DuplicateColumn *)basis_00);
      DuplicateColumn::undo
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
      break;
    case (HighsBasis *)0xd:
      HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)basis_00);
      HighsDataStack::pop<presolve::HighsPostsolveStack::SlackColSubstitution,_0>
                ((HighsDataStack *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (SlackColSubstitution *)basis_00);
      SlackColSubstitution::undo
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      break;
    default:
      pvVar3 = std::
               vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
               ::operator[](&in_RDI->reductions,local_30 - 1);
      printf("Reduction case %d not handled\n",(ulong)pvVar3->first);
    }
  }
  if (-1 < (int)in_R8D) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),(long)(int)in_R8D);
    printf("After last reduction: col_value[%2d] = %g\n",*pvVar4,(ulong)in_R8D);
  }
  return;
}

Assistant:

void undo(const HighsOptions& options, HighsSolution& solution,
            HighsBasis& basis, const HighsInt report_col = -1) {
    reductionValues.resetPosition();

    // Verify that undo can be performed
    assert(solution.value_valid);
    bool perform_dual_postsolve = solution.dual_valid;
    bool perform_basis_postsolve = basis.valid;

    // expand solution to original index space
    assert(origNumCol > 0);
    undoIterateBackwards(solution.col_value, origColIndex, origNumCol);

    assert(origNumRow >= 0);
    undoIterateBackwards(solution.row_value, origRowIndex, origNumRow);

    if (perform_dual_postsolve) {
      // if dual solution is given, expand dual solution and basis to original
      // index space
      undoIterateBackwards(solution.col_dual, origColIndex, origNumCol);

      undoIterateBackwards(solution.row_dual, origRowIndex, origNumRow);
    }

    if (perform_basis_postsolve) {
      // if basis is given, expand basis status values to original index space
      undoIterateBackwards(basis.col_status, origColIndex, origNumCol);

      undoIterateBackwards(basis.row_status, origRowIndex, origNumRow);
    }

    // now undo the changes
    for (size_t i = reductions.size(); i > 0; --i) {
      if (report_col >= 0)
        printf("Before  reduction %2d (type %2d): col_value[%2d] = %g\n",
               int(i - 1), int(reductions[i - 1].first), int(report_col),
               solution.col_value[report_col]);
      switch (reductions[i - 1].first) {
        case ReductionType::kLinearTransform: {
          LinearTransform reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution);
          break;
        }
        case ReductionType::kFreeColSubstitution: {
          FreeColSubstitution reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, colValues, solution, basis);
          break;
        }
        case ReductionType::kDoubletonEquation: {
          DoubletonEquation reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kEqualityRowAddition: {
          EqualityRowAddition reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kEqualityRowAdditions: {
          EqualityRowAdditions reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, colValues, solution, basis);
          break;
        }
        case ReductionType::kSingletonRow: {
          SingletonRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kFixedCol: {
          FixedCol reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kRedundantRow: {
          RedundantRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kForcingRow: {
          ForcingRow reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kForcingColumn: {
          ForcingColumn reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kForcingColumnRemovedRow: {
          ForcingColumnRemovedRow reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kDuplicateRow: {
          DuplicateRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kDuplicateColumn: {
          DuplicateColumn reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kSlackColSubstitution: {
          SlackColSubstitution reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        default:
          printf("Reduction case %d not handled\n",
                 int(reductions[i - 1].first));
          if (kAllowDeveloperAssert) assert(1 == 0);
      }
    }
    if (report_col >= 0)
      printf("After last reduction: col_value[%2d] = %g\n", int(report_col),
             solution.col_value[report_col]);

#ifdef DEBUG_EXTRA
    // solution should not contain NaN or Inf
    assert(!containsNanOrInf(solution.col_value));
    // row values are not determined by postsolve
    // assert(!containsNanOrInf(solution.row_value));
    assert(!containsNanOrInf(solution.col_dual));
    assert(!containsNanOrInf(solution.row_dual));
#endif
  }